

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTRealTraffic.cpp
# Opt level: O0

bool __thiscall RealTrafficConnection::ProcessFetchedData(RealTrafficConnection *this)

{
  RTLicTypeTy RVar1;
  bool bVar2;
  logLevelTy lVar3;
  int iVar4;
  uint uVar5;
  WeatherCtrlTy WVar6;
  undefined8 uVar7;
  long lVar8;
  char *pcVar9;
  ulong uVar10;
  DataRefs *this_00;
  string *stationId;
  size_t sVar11;
  RealTrafficConnection *in_RDI;
  float fVar12;
  float fVar13;
  double dVar14;
  JSON_Object *in_stack_000000b8;
  RealTrafficConnection *in_stack_000000c0;
  JSON_Object *in_stack_00000190;
  RealTrafficConnection *in_stack_00000198;
  char bufName [20];
  int i;
  bool bRet;
  JSON_Object *pData;
  time_point now;
  long diff;
  long bufTime;
  long simTime;
  long epoch;
  string metar;
  JSON_Object *in_stack_00000370;
  RealTrafficConnection *in_stack_00000378;
  string s;
  double wxQNH;
  long wrrl;
  long rrl;
  string rMsg;
  long rStatus;
  JSON_Object *pObj;
  JSONRootPtr pRoot;
  duration<long,_std::ratio<60L,_1L>_> *in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb40;
  JSON_Value_Type in_stack_fffffffffffffb44;
  undefined7 in_stack_fffffffffffffb48;
  undefined1 in_stack_fffffffffffffb4f;
  undefined4 in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb54;
  double in_stack_fffffffffffffb58;
  WxTy *in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb74;
  char *in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb84;
  undefined4 in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffb9c;
  undefined4 in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc24;
  JSON_Array *in_stack_fffffffffffffc28;
  allocator<char> *paVar15;
  RealTrafficConnection *in_stack_fffffffffffffc30;
  RealTrafficConnection *in_stack_fffffffffffffc38;
  bool local_399;
  char local_288 [32];
  uint local_268;
  byte local_261;
  JSON_Object *local_260;
  int local_254;
  duration<long,std::ratio<60l,1l>> local_250 [8];
  rep local_248;
  duration local_240;
  string local_238 [32];
  string local_218 [32];
  long local_1f8;
  long local_1f0;
  long local_1e8;
  long local_1e0;
  allocator<char> local_1d1;
  string local_1d0 [8];
  int local_1ac;
  duration<long,std::ratio<1l,1l>> local_1a8 [8];
  undefined8 local_1a0;
  duration local_198;
  positionTy local_190;
  byte local_141;
  string local_140 [39];
  allocator<char> local_119;
  string local_118 [32];
  char *local_f8;
  duration<long,std::ratio<1l,1000l>> local_f0 [8];
  undefined8 local_e8;
  duration local_e0;
  duration<long,std::ratio<1l,1000l>> local_d8 [8];
  undefined8 local_d0;
  duration local_c8;
  long local_c0;
  long local_b8;
  undefined8 local_b0;
  duration local_a8;
  undefined8 local_a0;
  duration local_98;
  rep local_90;
  undefined8 local_88;
  duration local_80;
  undefined8 local_78;
  duration local_70;
  allocator<char> local_61;
  string local_60 [32];
  long local_40;
  JSON_Object *local_38;
  undefined4 local_30;
  byte local_1;
  
  if ((in_RDI->super_LTFlightDataChannel).super_LTOnlineChannel.netDataPos == 0) {
    if ((in_RDI->super_LTFlightDataChannel).super_LTOnlineChannel.httpResponse != 200) {
      (*(in_RDI->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[8]
      )();
    }
    local_1 = 0;
    goto LAB_0021fdce;
  }
  JSONRootPtr::JSONRootPtr
            ((JSONRootPtr *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
             (char *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<json_value_t,_void_(*)(json_value_t_*)> *)0x21de52);
  if (bVar2) {
    std::unique_ptr<json_value_t,_void_(*)(json_value_t_*)>::get
              ((unique_ptr<json_value_t,_void_(*)(json_value_t_*)> *)
               CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    local_38 = json_object((JSON_Value *)0x21df02);
    if (local_38 == (JSON_Object *)0x0) {
      lVar3 = DataRefs::GetLogLevel(&dataRefs);
      if ((int)lVar3 < 4) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
               ,0x1c2,"ProcessFetchedData",logERR,"JSON: Getting main object failed");
      }
      (*(in_RDI->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[8]
      )();
      local_1 = 0;
      local_30 = 1;
    }
    else {
      local_40 = jog_l((JSON_Object *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                       (char *)in_stack_fffffffffffffb38);
      if (local_40 == 0) {
        lVar3 = DataRefs::GetLogLevel(&dataRefs);
        if ((int)lVar3 < 4) {
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                 ,0x1c6,"ProcessFetchedData",logERR,"Response has no \'status\'");
        }
        (*(in_RDI->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel
          [8])();
        local_1 = 0;
        local_30 = 1;
      }
      else {
        jog_s((JSON_Object *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
              (char *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                   in_stack_fffffffffffffb78,
                   (allocator<char> *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70))
        ;
        std::allocator<char>::~allocator(&local_61);
        if ((((in_RDI->curr).eRequType == RT_REQU_WEATHER) && (local_40 != 200)) &&
           (iVar4 = (in_RDI->rtWx).nErr + 1, (in_RDI->rtWx).nErr = iVar4, 4 < iVar4)) {
          lVar3 = DataRefs::GetLogLevel(&dataRefs);
          if ((int)lVar3 < 4) {
            LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                   ,0x1cf,"ProcessFetchedData",logERR,
                   "Too many errors trying to fetch RealTraffic weather, will continue without; planes may appear at slightly wrong altitude."
                  );
          }
          CreateMsgWindow(12.0,logERR,
                          "Too many errors trying to fetch RealTraffic weather, will continue without; planes may appear at slightly wrong altitude."
                         );
        }
        if (local_40 == 200) {
          local_b8 = jog_l((JSON_Object *)
                           CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                           (char *)in_stack_fffffffffffffb38);
          local_c0 = jog_l((JSON_Object *)
                           CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                           (char *)in_stack_fffffffffffffb38);
          switch((in_RDI->curr).eRequType) {
          case RT_REQU_AUTH:
          case RT_REQU_DEAUTH:
          case RT_REQU_PARKED:
          case RT_REQU_WEATHER:
            break;
          case RT_REQU_NEAREST_METAR:
            local_c0 = 0x32;
            break;
          case RT_REQU_TRAFFIC:
            if (local_b8 < 8000) {
              local_b8 = 8000;
            }
          }
          if (0 < local_b8) {
            local_d0 = std::chrono::_V2::steady_clock::now();
            std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long,void>
                      (local_d8,&local_b8);
            local_c8.__r = (rep)std::chrono::operator+
                                          ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                            *)CONCAT17(in_stack_fffffffffffffb4f,
                                                       in_stack_fffffffffffffb48),
                                           (duration<long,_std::ratio<1L,_1000L>_> *)
                                           CONCAT44(in_stack_fffffffffffffb44,
                                                    in_stack_fffffffffffffb40));
            (in_RDI->tNextTraffic).__d.__r = local_c8.__r;
          }
          if (0 < local_c0) {
            local_e8 = std::chrono::_V2::steady_clock::now();
            std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long,void>
                      (local_f0,&local_c0);
            local_e0.__r = (rep)std::chrono::operator+
                                          ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                            *)CONCAT17(in_stack_fffffffffffffb4f,
                                                       in_stack_fffffffffffffb48),
                                           (duration<long,_std::ratio<1L,_1000L>_> *)
                                           CONCAT44(in_stack_fffffffffffffb44,
                                                    in_stack_fffffffffffffb40));
            (in_RDI->tNextWeather).__d.__r = local_e0.__r;
          }
          if ((in_RDI->curr).eRequType == RT_REQU_AUTH) {
            lVar8 = jog_l((JSON_Object *)
                          CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                          (char *)in_stack_fffffffffffffb38);
            in_RDI->eLicType = (RTLicTypeTy)lVar8;
            pcVar9 = jog_s((JSON_Object *)
                           CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                           (char *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
            std::__cxx11::string::operator=((string *)&(in_RDI->curr).sGUID,pcVar9);
            uVar10 = std::__cxx11::string::empty();
            if ((uVar10 & 1) == 0) {
              lVar3 = DataRefs::GetLogLevel(&dataRefs);
              if ((int)lVar3 < 1) {
                RVar1 = in_RDI->eLicType;
                uVar7 = std::__cxx11::string::c_str();
                LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                       ,0x222,"ProcessFetchedData",logDEBUG,"Authenticated: type=%d, GUID=%s",
                       (ulong)RVar1,uVar7);
              }
              local_1 = 1;
              local_30 = 1;
            }
            else {
              lVar3 = DataRefs::GetLogLevel(&dataRefs);
              if ((int)lVar3 < 4) {
                LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                       ,0x21d,"ProcessFetchedData",logERR,"Did not actually receive a GUID:\n%s",
                       (in_RDI->super_LTFlightDataChannel).super_LTOnlineChannel.netData);
              }
              (*(in_RDI->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                _vptr_LTChannel[8])();
              local_1 = 0;
              local_30 = 1;
            }
          }
          else if ((in_RDI->curr).eRequType == RT_REQU_DEAUTH) {
            std::__cxx11::string::clear();
            lVar3 = DataRefs::GetLogLevel(&dataRefs);
            if ((int)lVar3 < 1) {
              LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                     ,0x229,"ProcessFetchedData",logDEBUG,"De-authenticated");
            }
            local_1 = 1;
            local_30 = 1;
          }
          else if ((in_RDI->curr).eRequType == RT_REQU_NEAREST_METAR) {
            json_object_get_array
                      ((JSON_Object *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                       (char *)in_stack_fffffffffffffb38);
            ProcessNearestMETAR(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
            local_1 = 1;
            local_30 = 1;
          }
          else if ((in_RDI->curr).eRequType == RT_REQU_WEATHER) {
            local_f8 = (char *)jog_n_nan((JSON_Object *)
                                         CONCAT17(in_stack_fffffffffffffb4f,
                                                  in_stack_fffffffffffffb48),
                                         (char *)CONCAT44(in_stack_fffffffffffffb44,
                                                          in_stack_fffffffffffffb40));
            uVar5 = std::isnan((double)local_f8);
            if ((uVar5 & 1) != 0) {
              local_f8 = (char *)jog_n_nan((JSON_Object *)
                                           CONCAT17(in_stack_fffffffffffffb4f,
                                                    in_stack_fffffffffffffb48),
                                           (char *)CONCAT44(in_stack_fffffffffffffb44,
                                                            in_stack_fffffffffffffb40));
            }
            jog_s((JSON_Object *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                  (char *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                       in_stack_fffffffffffffb78,
                       (allocator<char> *)
                       CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
            std::allocator<char>::~allocator(&local_119);
            uVar10 = std::__cxx11::string::empty();
            if ((uVar10 & 1) != 0) {
              pcVar9 = jog_s((JSON_Object *)
                             CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                             (char *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
              std::__cxx11::string::operator=(local_118,pcVar9);
              uVar5 = std::__cxx11::string::empty();
              local_141 = 0;
              local_399 = false;
              if ((uVar5 & 1) == 0) {
                bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT44(in_stack_fffffffffffffb44,
                                                    in_stack_fffffffffffffb40),
                                        (char *)in_stack_fffffffffffffb38);
                local_399 = false;
                if (bVar2) {
                  std::__cxx11::string::substr((ulong)local_140,(ulong)local_118);
                  local_141 = 1;
                  local_399 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)CONCAT44(in_stack_fffffffffffffb44,
                                                          in_stack_fffffffffffffb40),
                                              (char *)in_stack_fffffffffffffb38);
                }
              }
              if ((local_141 & 1) != 0) {
                std::__cxx11::string::~string(local_140);
              }
              if (local_399 != false) {
                std::__cxx11::string::clear();
              }
            }
            uVar10 = std::__cxx11::string::empty();
            if ((((uVar10 & 1) == 0) || (uVar5 = std::isnan((double)local_f8), (uVar5 & 1) != 0)) ||
               ((double)local_f8 < 800.0)) {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT44(in_stack_fffffffffffffb44,
                                                  in_stack_fffffffffffffb40),
                                      (char *)in_stack_fffffffffffffb38);
              if (bVar2) {
                lVar3 = DataRefs::GetLogLevel(&dataRefs);
                if ((int)lVar3 < 1) {
                  LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                         ,0x249,"ProcessFetchedData",logDEBUG,
                         "Weather details being fetched at RealTraffic, will try again in 60s");
                }
              }
              else {
                uVar10 = std::__cxx11::string::empty();
                if ((uVar10 & 1) == 0) {
                  lVar3 = DataRefs::GetLogLevel(&dataRefs);
                  if ((int)lVar3 < 4) {
                    uVar7 = std::__cxx11::string::c_str();
                    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                           ,0x24e,"ProcessFetchedData",logERR,
                           "Requesting RealTraffic weather returned error \'%s\':\n%s",uVar7,
                           (in_RDI->super_LTFlightDataChannel).super_LTOnlineChannel.netData);
                  }
                }
                else {
                  lVar3 = DataRefs::GetLogLevel(&dataRefs);
                  if ((int)lVar3 < 4) {
                    LogMsg(local_f8,0x3b1c2f,(char *)0x251,0x38894d,(char *)0x3,
                           "RealTraffic returned no or invalid local pressure %.1f:\n%s",
                           (in_RDI->super_LTFlightDataChannel).super_LTOnlineChannel.netData);
                  }
                }
              }
              (in_RDI->rtWx).nErr = (in_RDI->rtWx).nErr + 1;
              uVar5 = std::isnan((in_RDI->rtWx).QNH);
              if ((uVar5 & 1) != 0) {
                if ((in_RDI->rtWx).nErr < 5) {
                  local_1a0 = std::chrono::_V2::steady_clock::now();
                  local_1ac = 0x3c;
                  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                            (local_1a8,&local_1ac);
                  local_198.__r =
                       (rep)std::chrono::operator+
                                      ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                        *)CONCAT17(in_stack_fffffffffffffb4f,
                                                   in_stack_fffffffffffffb48),
                                       (duration<long,_std::ratio<1L,_1L>_> *)
                                       CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40)
                                      );
                  (in_RDI->tNextWeather).__d.__r = local_198.__r;
                }
                else {
                  lVar3 = DataRefs::GetLogLevel(&dataRefs);
                  if ((int)lVar3 < 4) {
                    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                           ,0x25a,"ProcessFetchedData",logERR,
                           "Too many errors trying to fetch RealTraffic weather, will continue without; planes may appear at slightly wrong altitude."
                          );
                  }
                  CreateMsgWindow(12.0,logERR,
                                  "Too many errors trying to fetch RealTraffic weather, will continue without; planes may appear at slightly wrong altitude."
                                 );
                  WxTy::set(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
                            CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                            (bool)in_stack_fffffffffffffb4f);
                  positionTy::positionTy(&local_190);
                  memcpy(&(in_RDI->rtWx).pos,&local_190,0x48);
                }
              }
              local_1 = 0;
              local_30 = 1;
            }
            else {
              pcVar9 = jog_s((JSON_Object *)
                             CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                             (char *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
              std::__cxx11::string::operator=(local_118,pcVar9);
              this_00 = (DataRefs *)
                        jog_s((JSON_Object *)
                              CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                              (char *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48))
              ;
              paVar15 = &local_1d1;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                         in_stack_fffffffffffffb78,
                         (allocator<char> *)
                         CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
              std::allocator<char>::~allocator(&local_1d1);
              uVar10 = std::__cxx11::string::empty();
              if ((uVar10 & 1) == 0) {
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT44(in_stack_fffffffffffffb44,
                                                    in_stack_fffffffffffffb40),
                                        (char *)in_stack_fffffffffffffb38);
                in_stack_fffffffffffffc24 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffc24);
                if (bVar2) goto LAB_0021f2e5;
              }
              else {
LAB_0021f2e5:
                std::__cxx11::string::clear();
                std::__cxx11::string::clear();
              }
              bVar2 = isHistoric(in_RDI);
              fVar13 = (float)CONCAT13((char)((uint)in_stack_fffffffffffffc24 >> 0x18),
                                       CONCAT12(bVar2,(short)in_stack_fffffffffffffc24));
              if (bVar2) {
                fVar13 = WeatherQNHfromMETAR((string *)
                                             CONCAT44(in_stack_fffffffffffffb9c,
                                                      in_stack_fffffffffffffb98));
                (in_RDI->rtWx).w.qnh_pas = fVar13;
              }
              else {
                fVar12 = (float)(double)local_f8;
                stationId = (string *)positionTy::lat(&(in_RDI->rtWx).pos);
                positionTy::lon(&(in_RDI->rtWx).pos);
                fVar13 = DataRefs::SetWeather
                                   (this_00,(float)((ulong)paVar15 >> 0x20),SUB84(paVar15,0),fVar13,
                                    stationId,(string *)CONCAT44(fVar12,in_stack_fffffffffffffc10));
                (in_RDI->rtWx).w.qnh_pas = fVar13;
              }
              std::isnan((double)(ulong)(uint)(in_RDI->rtWx).w.qnh_pas);
              WxTy::set(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
                        CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                        (bool)in_stack_fffffffffffffb4f);
              lVar3 = DataRefs::GetLogLevel(&dataRefs);
              if ((int)lVar3 < 1) {
                LogMsg((char *)(in_RDI->rtWx).QNH,0x3b1c2f,(char *)0x27c,0x38894d,(char *)0x0,
                       "Received RealTraffic Weather with QNH = %.1f");
              }
              WVar6 = DataRefs::GetWeatherControl(&dataRefs);
              if (WVar6 == WC_REAL_TRAFFIC) {
                json_object_get_object
                          ((JSON_Object *)
                           CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                           (char *)in_stack_fffffffffffffb38);
                ProcessWeather(in_stack_000000c0,in_stack_000000b8);
                uVar5 = std::isnan((double)(ulong)(uint)(in_RDI->rtWx).w.qnh_pas);
                if ((uVar5 & 1) != 0) {
                  (in_RDI->rtWx).w.qnh_pas = (float)(in_RDI->rtWx).QNH;
                }
              }
              local_1 = 1;
              local_30 = 1;
              std::__cxx11::string::~string(local_1d0);
            }
            std::__cxx11::string::~string(local_118);
          }
          else if ((in_RDI->curr).eRequType == RT_REQU_PARKED) {
            in_RDI->bDoParkedTraffic = false;
            json_object_get_object
                      ((JSON_Object *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                       (char *)in_stack_fffffffffffffb38);
            local_1 = ProcessParkedAcBuffer(in_stack_00000378,in_stack_00000370);
            local_30 = 1;
          }
          else {
            local_1e0 = jog_l((JSON_Object *)
                              CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                              (char *)in_stack_fffffffffffffb38);
            if (0x5c2b5640 < local_1e0) {
              dVar14 = DataRefs::GetSimTime(&dataRefs);
              local_1e8 = (long)dVar14;
              iVar4 = DataRefs::GetFdBufPeriod(&dataRefs);
              local_1f0 = (long)iVar4;
              if (local_1e8 + local_1f0 / 2 < local_1e0) {
                if (0.0 < in_RDI->tsAdjust) {
                  lVar3 = DataRefs::GetLogLevel(&dataRefs);
                  if ((int)lVar3 < 2) {
                    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                           ,0x29b,"ProcessFetchedData",logINFO,
                           "RealTraffic: Tracking data is real-time again.");
                  }
                  CreateMsgWindow(8.0,logINFO,"RealTraffic: Tracking data is real-time again.");
                }
                in_RDI->tsAdjust = 0.0;
              }
              else {
                local_1f8 = ((local_1e8 + local_1f0) - local_1e0) + -10;
                local_1f8 = (0x3c - local_1f8 % 0x3c) + local_1f8;
                if ((long)in_RDI->tsAdjust != local_1f8) {
                  in_RDI->tsAdjust = (double)local_1f8;
                  lVar3 = DataRefs::GetLogLevel(&dataRefs);
                  if ((int)lVar3 < 2) {
                    GetAdjustTSText_abi_cxx11_(in_stack_fffffffffffffc38);
                    uVar7 = std::__cxx11::string::c_str();
                    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                           ,0x2a6,"ProcessFetchedData",logINFO,
                           "RealTraffic: Receive and display past tracking data from %s",uVar7);
                    std::__cxx11::string::~string(local_218);
                  }
                  GetAdjustTSText_abi_cxx11_(in_stack_fffffffffffffc38);
                  uVar7 = std::__cxx11::string::c_str();
                  CreateMsgWindow(8.0,logINFO,
                                  "RealTraffic: Receive and display past tracking data from %s",
                                  uVar7);
                  std::__cxx11::string::~string(local_238);
                }
              }
            }
            lVar8 = jog_l((JSON_Object *)
                          CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                          (char *)in_stack_fffffffffffffb38);
            in_RDI->lTotalFlights = lVar8;
            if (in_RDI->lTotalFlights == 0) {
              local_240.__r = std::chrono::_V2::steady_clock::now();
              local_248 = (rep)std::chrono::operator-
                                         ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                           *)CONCAT17(in_stack_fffffffffffffb4f,
                                                      in_stack_fffffffffffffb48),
                                          (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                           *)CONCAT44(in_stack_fffffffffffffb44,
                                                      in_stack_fffffffffffffb40));
              local_254 = 5;
              std::chrono::duration<long,std::ratio<60l,1l>>::duration<int,void>
                        (local_250,&local_254);
              bVar2 = std::chrono::operator>
                                ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                                 CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                                 in_stack_fffffffffffffb38);
              if (bVar2) {
                lVar3 = DataRefs::GetLogLevel(&dataRefs);
                if ((int)lVar3 < 3) {
                  pcVar9 = "(full_count=0)";
                  if (0 < (in_RDI->curr).tOff) {
                    pcVar9 = "Maybe requested historic data too far in the past?";
                  }
                  LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                         ,0x2b3,"ProcessFetchedData",logWARN,"RealTraffic has no traffic at all! %s"
                         ,pcVar9);
                }
                pcVar9 = "(full_count=0)";
                if (0 < (in_RDI->curr).tOff) {
                  pcVar9 = "Maybe requested historic data too far in the past?";
                }
                CreateMsgWindow(8.0,logWARN,"RealTraffic has no traffic at all! %s",pcVar9);
                ProcessFetchedData::prevWarn.__d.__r = (duration)(duration)local_240.__r;
              }
            }
            local_260 = json_object_get_object
                                  ((JSON_Object *)
                                   CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                                   (char *)in_stack_fffffffffffffb38);
            if (local_260 == (JSON_Object *)0x0) {
              lVar3 = DataRefs::GetLogLevel(&dataRefs);
              if ((int)lVar3 < 4) {
                LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                       ,0x2bd,"ProcessFetchedData",logERR,
                       "Response is missing the \'data\' object that would have the aircraft data!")
                ;
              }
              (*(in_RDI->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                _vptr_LTChannel[8])();
              local_1 = 0;
              local_30 = 1;
            }
            else {
              local_261 = 1;
              iVar4 = json_object_has_value_of_type
                                ((JSON_Object *)
                                 CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                                 (char *)CONCAT17(in_stack_fffffffffffffb4f,
                                                  in_stack_fffffffffffffb48),
                                 in_stack_fffffffffffffb44);
              if (iVar4 == 0) {
                local_261 = ProcessTrafficBuffer(in_stack_00000198,in_stack_00000190);
              }
              else {
                sVar11 = json_object_get_count(local_260);
                local_268 = (uint)sVar11;
                while (local_268 = local_268 - 1, -1 < (int)local_268) {
                  snprintf(local_288,0x14,"buffer_%d",(ulong)local_268);
                  json_object_get_object
                            ((JSON_Object *)
                             CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                             (char *)in_stack_fffffffffffffb38);
                  bVar2 = ProcessTrafficBuffer(in_stack_00000198,in_stack_00000190);
                  if ((!bVar2) && (local_268 == 0)) {
                    lVar3 = DataRefs::GetLogLevel(&dataRefs);
                    if ((int)lVar3 < 3) {
                      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                             ,0x2cd,"ProcessFetchedData",logWARN,"Couldn\'t process \'buffer_0\'!");
                    }
                    (*(in_RDI->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                      _vptr_LTChannel[8])();
                    local_261 = 0;
                  }
                }
              }
              local_1 = local_261 & 1;
              local_30 = 1;
            }
          }
        }
        else if (local_40 == 0x191) {
          lVar3 = DataRefs::GetLogLevel(&dataRefs);
          if ((int)lVar3 < 1) {
            LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                   ,0x1ed,"ProcessFetchedData",logDEBUG,"Session expired");
          }
          std::__cxx11::string::clear();
          local_90 = std::chrono::_V2::steady_clock::now();
          (in_RDI->tNextWeather).__d.__r = local_90;
          (in_RDI->tNextTraffic).__d.__r = (in_RDI->tNextWeather).__d.__r;
          local_1 = 0;
          local_30 = 1;
        }
        else if (local_40 == 0x192) {
LAB_0021e24b:
          if ((in_RDI->curr).eRequType == RT_REQU_AUTH) {
            lVar3 = DataRefs::GetLogLevel(&dataRefs);
            if ((int)lVar3 < 4) {
              uVar7 = std::__cxx11::string::c_str();
              LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                     ,0x1da,"ProcessFetchedData",logERR,"RealTraffic license invalid: %s",uVar7);
            }
            uVar7 = std::__cxx11::string::c_str();
            CreateMsgWindow(12.0,logERR,"RealTraffic license invalid: %s",uVar7);
            (*(in_RDI->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
              _vptr_LTChannel[7])(in_RDI,0,1);
            local_1 = 0;
            local_30 = 1;
          }
          else {
            lVar3 = DataRefs::GetLogLevel(&dataRefs);
            if ((int)lVar3 < 3) {
              uVar7 = std::__cxx11::string::c_str();
              LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                     ,0x1de,"ProcessFetchedData",logWARN,"RealTraffic returned: %s",uVar7);
            }
            (*(in_RDI->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
              _vptr_LTChannel[8])();
            local_78 = std::chrono::_V2::steady_clock::now();
            local_70.__r = (rep)std::chrono::operator+
                                          ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                            *)CONCAT17(in_stack_fffffffffffffb4f,
                                                       in_stack_fffffffffffffb48),
                                           (duration<long,_std::ratio<1L,_1L>_> *)
                                           CONCAT44(in_stack_fffffffffffffb44,
                                                    in_stack_fffffffffffffb40));
            (in_RDI->tNextWeather).__d.__r = local_70.__r;
            (in_RDI->tNextTraffic).__d.__r = (in_RDI->tNextWeather).__d.__r;
            local_1 = 0;
            local_30 = 1;
          }
        }
        else if (local_40 == 0x193) {
          lVar3 = DataRefs::GetLogLevel(&dataRefs);
          if ((int)lVar3 < 3) {
            uVar7 = std::__cxx11::string::c_str();
            LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                   ,499,"ProcessFetchedData",logWARN,"RealTraffic forbidden: %s",uVar7);
          }
          (*(in_RDI->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
            _vptr_LTChannel[8])();
          local_a0 = std::chrono::_V2::steady_clock::now();
          local_98.__r = (rep)std::chrono::operator+
                                        ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                          *)CONCAT17(in_stack_fffffffffffffb4f,
                                                     in_stack_fffffffffffffb48),
                                         (duration<long,_std::ratio<1L,_1L>_> *)
                                         CONCAT44(in_stack_fffffffffffffb44,
                                                  in_stack_fffffffffffffb40));
          (in_RDI->tNextWeather).__d.__r = local_98.__r;
          (in_RDI->tNextTraffic).__d.__r = (in_RDI->tNextWeather).__d.__r;
          local_1 = 0;
          local_30 = 1;
        }
        else {
          if (local_40 == 0x194) goto LAB_0021e24b;
          if (local_40 == 0x195) {
            lVar3 = DataRefs::GetLogLevel(&dataRefs);
            if ((int)lVar3 < 4) {
              uVar7 = std::__cxx11::string::c_str();
              LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                     ,0x1e5,"ProcessFetchedData",logERR,"RealTraffic: %s",uVar7);
            }
            (*(in_RDI->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
              _vptr_LTChannel[8])();
            local_88 = std::chrono::_V2::steady_clock::now();
            local_80.__r = (rep)std::chrono::operator+
                                          ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                            *)CONCAT17(in_stack_fffffffffffffb4f,
                                                       in_stack_fffffffffffffb48),
                                           (duration<long,_std::ratio<1L,_1L>_> *)
                                           CONCAT44(in_stack_fffffffffffffb44,
                                                    in_stack_fffffffffffffb40));
            (in_RDI->tNextWeather).__d.__r = local_80.__r;
            (in_RDI->tNextTraffic).__d.__r = (in_RDI->tNextWeather).__d.__r;
            std::__cxx11::string::clear();
            local_1 = 0;
            local_30 = 1;
          }
          else {
            lVar3 = DataRefs::GetLogLevel(&dataRefs);
            if ((int)lVar3 < 4) {
              uVar7 = std::__cxx11::string::c_str();
              LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                     ,0x1fa,"ProcessFetchedData",logERR,"RealTraffic returned an error: %s",uVar7);
            }
            uVar7 = std::__cxx11::string::c_str();
            CreateMsgWindow(12.0,logERR,"RealTraffic returned an error: %s",uVar7);
            (*(in_RDI->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
              _vptr_LTChannel[8])();
            local_b0 = std::chrono::_V2::steady_clock::now();
            local_a8.__r = (rep)std::chrono::operator+
                                          ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                            *)CONCAT17(in_stack_fffffffffffffb4f,
                                                       in_stack_fffffffffffffb48),
                                           (duration<long,_std::ratio<1L,_1L>_> *)
                                           CONCAT44(in_stack_fffffffffffffb44,
                                                    in_stack_fffffffffffffb40));
            (in_RDI->tNextWeather).__d.__r = local_a8.__r;
            (in_RDI->tNextTraffic).__d.__r = (in_RDI->tNextWeather).__d.__r;
            local_1 = 0;
            local_30 = 1;
          }
        }
        std::__cxx11::string::~string(local_60);
      }
    }
  }
  else {
    lVar3 = DataRefs::GetLogLevel(&dataRefs);
    if ((int)lVar3 < 4) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
             ,0x1c0,"ProcessFetchedData",logERR,"Parsing flight data as JSON failed");
    }
    (*(in_RDI->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[8])
              ();
    local_1 = 0;
    local_30 = 1;
  }
  JSONRootPtr::~JSONRootPtr((JSONRootPtr *)0x21fdbd);
LAB_0021fdce:
  return (bool)(local_1 & 1);
}

Assistant:

bool RealTrafficConnection::ProcessFetchedData ()
{
    // No data!
    if (!netDataPos) {
        if (httpResponse != HTTP_OK)
            IncErrCnt();
        return false;
    }
    
    // Try to parse as JSON...even in case of errors we might be getting a body
    // Unique_ptr ensures it is freed before leaving the function
    JSONRootPtr pRoot (netData);
    if (!pRoot) { LOG_MSG(logERR,ERR_JSON_PARSE); IncErrCnt(); return false; }
    JSON_Object* pObj = json_object(pRoot.get());
    if (!pObj) { LOG_MSG(logERR,ERR_JSON_MAIN_OBJECT); IncErrCnt(); return false; }
    
    // Try the error fields first
    long rStatus = jog_l(pObj, "status");
    if (!rStatus) { LOG_MSG(logERR,"Response has no 'status'"); IncErrCnt(); return false; }
    
    std::string rMsg = jog_s(pObj, "message");
    
    // --- Error processing ---
    
    // For failed weather requests keep a separate counter
    if (curr.eRequType == CurrTy::RT_REQU_WEATHER && rStatus != HTTP_OK) {
        if (++rtWx.nErr >= RT_DRCT_MAX_WX_ERR) { // Too many WX errors?
            SHOW_MSG(logERR, "Too many errors trying to fetch RealTraffic weather, will continue without; planes may appear at slightly wrong altitude.");
        }
    }
    
    switch (rStatus) {
        case HTTP_OK:
            break;                                  // All good, just continue
            
        case HTTP_PAYMENT_REQU:
        case HTTP_NOT_FOUND:
            if (curr.eRequType == CurrTy::RT_REQU_AUTH) {
                SHOW_MSG(logERR, "RealTraffic license invalid: %s", rMsg.c_str());
                SetValid(false,true);               // set invalid, stop trying
                return false;
            } else {
                LOG_MSG(logWARN, "RealTraffic returned: %s", rMsg.c_str());
                IncErrCnt();
                tNextTraffic = tNextWeather = std::chrono::steady_clock::now() + RT_DRCT_ERR_WAIT;
                return false;
            }
            
        case HTTP_METH_NOT_ALLWD:                   // Send for "too many sessions" / "request rate violation"
            LOG_MSG(logERR, "RealTraffic: %s", rMsg.c_str());
            IncErrCnt();
            // documentation says "wait 10 seconds"
            tNextTraffic = tNextWeather = std::chrono::steady_clock::now() + RT_DRCT_ERR_RATE;
            curr.sGUID.clear();                     // force re-login
            return false;
            
        case HTTP_UNAUTHORIZED:                     // means our GUID expired
            LOG_MSG(logDEBUG, "Session expired");
            curr.sGUID.clear();                     // re-login immediately
            tNextTraffic = tNextWeather = std::chrono::steady_clock::now();
            return false;
            
        case HTTP_FORBIDDEN:
            LOG_MSG(logWARN, "RealTraffic forbidden: %s", rMsg.c_str());
            IncErrCnt();
            tNextTraffic = tNextWeather = std::chrono::steady_clock::now() + RT_DRCT_ERR_WAIT;
            return false;
            
        case HTTP_INTERNAL_ERR:
        default:
            SHOW_MSG(logERR, "RealTraffic returned an error: %s", rMsg.c_str());
            IncErrCnt();
            tNextTraffic = tNextWeather = std::chrono::steady_clock::now() + RT_DRCT_ERR_WAIT;
            return false;
    }
    
    // All good, process the request
    
    // Wait till next request?
    long rrl = jog_l(pObj, "rrl");                  // Wait time till next request, separately for traffic and weather
    long wrrl = jog_l(pObj, "wrrl");
    switch (curr.eRequType) {
        case CurrTy::RT_REQU_AUTH:                  // in most cases we continue as quickly as possible
        case CurrTy::RT_REQU_DEAUTH:
        case CurrTy::RT_REQU_PARKED:
        case CurrTy::RT_REQU_WEATHER:
            break;
        case CurrTy::RT_REQU_NEAREST_METAR:         // after learning the META we continue quickly with the weather request
            wrrl = 50;
            break;
        case CurrTy::RT_REQU_TRAFFIC:               // By default we wait at least 8s, or more if RealTraffic instructs us so
            if (rrl < RT_DRCT_DEFAULT_WAIT)
                rrl = RT_DRCT_DEFAULT_WAIT;
            break;
    }
    if (rrl > 0)
        tNextTraffic = std::chrono::steady_clock::now() + std::chrono::milliseconds(rrl);
    if (wrrl > 0)
        tNextWeather = std::chrono::steady_clock::now() + std::chrono::milliseconds(wrrl);
    
    // --- Authorization ---
    if (curr.eRequType == CurrTy::RT_REQU_AUTH) {
        eLicType = RTLicTypeTy(jog_l(pObj, "type"));
        curr.sGUID = jog_s(pObj, "GUID");
        if (curr.sGUID.empty()) {
            LOG_MSG(logERR, "Did not actually receive a GUID:\n%s", netData);
            IncErrCnt();
            return false;
        }
        LOG_MSG(logDEBUG, "Authenticated: type=%d, GUID=%s",
                eLicType, curr.sGUID.c_str());
        return true;
    }
    
    // --- De-authentication (closing the session) ---
    if (curr.eRequType == CurrTy::RT_REQU_DEAUTH) {
        curr.sGUID.clear();
        LOG_MSG(logDEBUG, "De-authenticated");
        return true;
    }
    
    // --- Nearest METAR location ---
    if (curr.eRequType == CurrTy::RT_REQU_NEAREST_METAR) {
        ProcessNearestMETAR(json_object_get_array(pObj, "data"));
        return true;
    }
    
    // --- Weather ---
    if (curr.eRequType == CurrTy::RT_REQU_WEATHER) {
        // Here, we are interested in just a single value: local Pressure
        double wxQNH = jog_n_nan(pObj, "data.QNH");         // ideally QNH
        if (std::isnan(wxQNH))
            wxQNH = jog_n_nan(pObj, "data.locWX.SLP");      // of not given then SLP
        
        // Error in locWX data?
        std::string s = jog_s(pObj, "data.locWX.Error");                    // sometimes errors are given in a specific field
        if (s.empty()) {                                                    // and at other times there is something in the 'Info' field...not very consistent
            s = jog_s(pObj, "data.locWX.Info");
            if (!s.empty() &&
                s != "TinyDelta" &&                                         // if we request too often then Info is 'TinyDelta', and we let it sit in 's'
                s.substr(0,6) != "error:")                                  // any error starts with "error:" and we let it sit in 's'
                s.clear();
        }
        
        // Any error, either explicitely or because local pressure is bogus?
        if (!s.empty() || std::isnan(wxQNH) || wxQNH < 800.0)
        {
            if (s == "File requested") {
                // Error "File requested" often occurs when requesting historic weather that isn't cached on the server, so we only issue debug-level message
                LOG_MSG(logDEBUG, "Weather details being fetched at RealTraffic, will try again in 60s");
            } else {
                // Anything else is unexpected
                if (!s.empty()) {
                    LOG_MSG(logERR, "Requesting RealTraffic weather returned error '%s':\n%s",
                            s.c_str(), netData);
                } else {
                    LOG_MSG(logERR, "RealTraffic returned no or invalid local pressure %.1f:\n%s",
                            wxQNH, netData);
                }
            }
            // one more error
            ++rtWx.nErr;
            // If we don't yet have any pressure...
            if (std::isnan(rtWx.QNH)) {
                // Too many WX errors? We give up and just use standard pressure
                if (rtWx.nErr >= RT_DRCT_MAX_WX_ERR) {
                    SHOW_MSG(logERR, "Too many errors trying to fetch RealTraffic weather, will continue without; planes may appear at slightly wrong altitude.");
                    rtWx.set(HPA_STANDARD, curr.tOff, false);
                    rtWx.pos = positionTy();
                } else {
                    // We will request weather directly again, but need to wait 60s for it
                    tNextWeather = std::chrono::steady_clock::now() + std::chrono::seconds(60);
                }
            }
            return false;
        }
        
        // If we have METAR info pass that on, too
        s = jog_s(pObj, "data.ICAO");
        std::string metar = jog_s(pObj, "data.METAR");
        
        if (s.empty() || s == "UNKN") {         // ignore no/unknown METAR
            s.clear();
            metar.clear();
        }
            
        // If this is live data, not historic, then we can use it instead of separately querying METAR
        if (!isHistoric()) {
            rtWx.w.qnh_pas = dataRefs.SetWeather((float)wxQNH,
                                                 (float)rtWx.pos.lat(), (float)rtWx.pos.lon(),
                                                 s, metar);
        }
        // historic data
        else {
            // Try reading QNH from METAR
            rtWx.w.qnh_pas = WeatherQNHfromMETAR(metar);
        }
        
        // Successfully received local pressure information
        rtWx.set(std::isnan(rtWx.w.qnh_pas) ? wxQNH : double(rtWx.w.qnh_pas), curr.tOff);   // Save new QNH
        LOG_MSG(logDEBUG, "Received RealTraffic Weather with QNH = %.1f", rtWx.QNH);
        
        // If requested to set X-Plane's weather based on detailed weather data
        if (dataRefs.GetWeatherControl() == WC_REAL_TRAFFIC) {
            ProcessWeather (json_object_get_object(pObj, "data"));
            if (std::isnan(rtWx.w.qnh_pas))
                rtWx.w.qnh_pas = float(rtWx.QNH);
        }
        
        return true;
    }
    
    // --- Parked Aircraft ---
    if (curr.eRequType == CurrTy::RT_REQU_PARKED) {
        bDoParkedTraffic = false;                       // Repeat only when instructed
        return ProcessParkedAcBuffer(json_object_get_object(pObj, "data"));
    }

    // --- Traffic data ---
    
    // In `dataepoch` RealTraffic delivers the point in time when the data was valid.
    // That is relevant especially for historic data, when `dataepoch` is in the past.
    const long epoch = jog_l(pObj, "dataepoch");
    if (epoch > long(JAN_FIRST_2019))
    {
        // "now" is the simulated time plus the buffering period
        const long simTime  = long(dataRefs.GetSimTime());
        const long bufTime  = long(dataRefs.GetFdBufPeriod());
        // As long as the timestamp is half the buffer time close to "now" we consider the data current, ie. non-historic
        if (epoch > simTime + bufTime/2) {
            if (tsAdjust > 0.0) {                       // is that a change from historic delivery?
                SHOW_MSG(logINFO, INFO_RT_REAL_TIME);
            }
            tsAdjust = 0.0;
        }
        // we have historic data
        else {
            long diff = simTime + bufTime - epoch;      // difference between "now"
            diff -= 10;                                 // rounding 10s above the minute down,
            diff += 60 - diff % 60;                     // everything else up to the next minute
            if (long(tsAdjust) != diff) {               // is this actually a change?
                tsAdjust = double(diff);
                SHOW_MSG(logINFO, INFO_RT_ADJUST_TS, GetAdjustTSText().c_str());
            }
        }
    }